

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O3

void Supp_ManRecycle(Supp_Man_t *p,char *pMemory,int nSize)

{
  bool bVar1;
  int iVar2;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  
  iVar2 = nSize / p->nStepSize;
  bVar1 = 0 < nSize % p->nStepSize;
  uVar6 = iVar2 + (uint)bVar1;
  pVVar8 = p->vFree;
  iVar5 = pVVar8->nSize;
  if ((int)uVar6 < iVar5) goto LAB_002e98f9;
  iVar7 = iVar2 + (uint)bVar1 + 1;
  iVar2 = pVVar8->nCap;
  if ((int)uVar6 < iVar2 * 2) {
    if (iVar2 <= (int)uVar6) {
      if (pVVar8->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((long)iVar2 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar8->pArray,(long)iVar2 << 4);
      }
      pVVar8->pArray = ppvVar3;
      iVar5 = iVar2 * 2;
LAB_002e98cc:
      pVVar8->nCap = iVar5;
      iVar5 = pVVar8->nSize;
    }
  }
  else if (iVar2 <= (int)uVar6) {
    if (pVVar8->pArray == (void **)0x0) {
      ppvVar3 = (void **)malloc((long)iVar7 << 3);
    }
    else {
      ppvVar3 = (void **)realloc(pVVar8->pArray,(long)iVar7 << 3);
    }
    pVVar8->pArray = ppvVar3;
    iVar5 = iVar7;
    goto LAB_002e98cc;
  }
  if (iVar5 <= (int)uVar6) {
    lVar4 = (long)iVar5;
    do {
      pVVar8->pArray[lVar4] = (void *)0x0;
      lVar4 = lVar4 + 1;
    } while (iVar7 != lVar4);
  }
  pVVar8->nSize = iVar7;
  pVVar8 = p->vFree;
LAB_002e98f9:
  if ((-1 < (int)uVar6) && ((int)uVar6 < pVVar8->nSize)) {
    *(void **)pMemory = pVVar8->pArray[uVar6];
    if ((int)uVar6 < p->vFree->nSize) {
      p->vFree->pArray[uVar6] = pMemory;
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Supp_ManRecycle( Supp_Man_t * p, char * pMemory, int nSize )
{
    int Type;
    Type = Supp_SizeType( nSize, p->nStepSize );
    Vec_PtrFillExtra( p->vFree, Type + 1, NULL );
    Supp_OneSetNext( pMemory, (char *)Vec_PtrEntry(p->vFree, Type) );
    Vec_PtrWriteEntry( p->vFree, Type, pMemory );
}